

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printCPSIFlag(MCInst *MI,uint OpNum,SStream *O)

{
  MCOperand *op;
  int64_t iVar1;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  int i;
  uint IFlags;
  MCOperand *Op;
  char *in_stack_ffffffffffffffc8;
  SStream *in_stack_ffffffffffffffd0;
  int local_28;
  arm_cpsflag_type local_24;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  iVar1 = MCOperand_getImm(op);
  local_24 = (arm_cpsflag_type)iVar1;
  for (local_28 = 2; -1 < local_28; local_28 = local_28 + -1) {
    if ((local_24 & 1 << ((byte)local_28 & 0x1f)) != ARM_CPSFLAG_INVALID) {
      in_stack_ffffffffffffffd0 = in_RDX;
      ARM_PROC_IFlagsToString(1 << ((byte)local_28 & 0x1f));
      SStream_concat0(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
  }
  if (local_24 == ARM_CPSFLAG_INVALID) {
    SStream_concat0(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_24 = ARM_CPSFLAG_NONE;
  }
  if (in_RDI->csh->detail != CS_OPT_OFF) {
    (in_RDI->flat_insn->detail->field_6).arm.cps_flag = local_24;
  }
  return;
}

Assistant:

static void printCPSIFlag(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);
	unsigned IFlags = (unsigned int)MCOperand_getImm(Op);
	int i;

	for (i = 2; i >= 0; --i)
		if (IFlags & (1 << i)) {
			SStream_concat0(O, ARM_PROC_IFlagsToString(1 << i));
		}

	if (IFlags == 0) {
		SStream_concat0(O, "none");
		IFlags = ARM_CPSFLAG_NONE;
	}

	if (MI->csh->detail) {
		MI->flat_insn->detail->arm.cps_flag = IFlags;
	}
}